

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O1

void __thiscall
KMaxDistance::edgeCosts
          (KMaxDistance *this,double *image,int width,int height,double brSigma,double sxy,
          double *xCosts,double *yCosts)

{
  ulong uVar1;
  double *pdVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  uVar1 = (ulong)(uint)width;
  if (0 < height) {
    pdVar2 = image + 1;
    uVar3 = 0;
    auVar5._8_8_ = 0x7fffffffffffffff;
    auVar5._0_8_ = 0x7fffffffffffffff;
    do {
      if (1 < width) {
        uVar4 = 0;
        do {
          auVar7._8_8_ = 0;
          auVar7._0_8_ = pdVar2[uVar4 - 1] - pdVar2[uVar4];
          auVar7 = vandpd_avx(auVar7,auVar5);
          xCosts[uVar4] = auVar7._0_8_ + sxy;
          uVar4 = uVar4 + 1;
        } while (width - 1 != uVar4);
      }
      uVar3 = uVar3 + 1;
      xCosts = xCosts + uVar1;
      pdVar2 = pdVar2 + uVar1;
    } while (uVar3 != (uint)height);
  }
  if (1 < height) {
    pdVar2 = image + uVar1;
    uVar3 = 0;
    auVar6._8_8_ = 0x7fffffffffffffff;
    auVar6._0_8_ = 0x7fffffffffffffff;
    do {
      if (0 < width) {
        uVar4 = 0;
        do {
          auVar8._8_8_ = 0;
          auVar8._0_8_ = image[uVar4] - pdVar2[uVar4];
          auVar5 = vandpd_avx(auVar8,auVar6);
          yCosts[uVar4] = auVar5._0_8_ + sxy;
          uVar4 = uVar4 + 1;
        } while (uVar1 != uVar4);
      }
      uVar3 = uVar3 + 1;
      pdVar2 = pdVar2 + uVar1;
      yCosts = yCosts + uVar1;
      image = image + uVar1;
    } while (uVar3 != height - 1);
  }
  return;
}

Assistant:

void KMaxDistance::edgeCosts( const double *image, const int width, const int height,
    const double brSigma, const double sxy, double *xCosts, double *yCosts ){
    
    //double sxy2 = sxy*sxy;
    for ( int y = 0; y < height; ++y ){
        for ( int x = 0; x < width-1; ++x ){
            int idx = y*width + x;
            //double dbr = gaussInv( image[idx] - image[idx+1], brSigma );
            //xCosts[idx] = sqrt( sxy2 + dbr*dbr );
            xCosts[idx] = fabs(image[idx] - image[idx+1]) + sxy;
        }
    }
    for ( int y = 0; y < height-1; ++y ){
        for ( int x = 0; x < width; ++x ){
            int idx = y*width + x;
            //double dbr = gaussInv( image[idx] - image[idx+width], brSigma );
            //yCosts[idx] = sqrt( sxy2 + dbr*dbr );
            yCosts[idx] = fabs(image[idx] - image[idx+width]) + sxy;
        }
    }
}